

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O3

Roaring * __thiscall doublechecked::Roaring::operator&=(Roaring *this,Roaring *r)

{
  _Rb_tree_header *__last;
  iterator __position;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  
  roaring_bitmap_and_inplace((roaring_bitmap_t *)this,(roaring_bitmap_t *)r);
  __position._M_node = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __last = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(r->check)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2 && (_Rb_tree_header *)__position._M_node != __last) {
    do {
      if (__position._M_node[1]._M_color < p_Var1[1]._M_color) {
        __position = std::
                     _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                         *)&this->check,__position._M_node);
      }
      else {
        if (__position._M_node[1]._M_color <= p_Var1[1]._M_color) {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      }
    } while (((_Rb_tree_header *)__position._M_node != __last) &&
            ((_Rb_tree_header *)p_Var1 != p_Var2));
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_erase_aux(&(this->check)._M_t,(const_iterator)__position._M_node,(const_iterator)__last);
  return this;
}

Assistant:

Roaring &operator&=(const Roaring &r) {
        plain &= r.plain;

        auto it = check.begin();
        auto r_it = r.check.begin();
        while (it != check.end() && r_it != r.check.end()) {
            if (*it < *r_it) {
                it = check.erase(it);
            } else if (*r_it < *it) {
                ++r_it;
            } else {
                ++it;
                ++r_it;
            }  // overlapped
        }
        check.erase(it, check.end());  // erase rest of check not in r.check

        return *this;
    }